

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

bool __thiscall
cfd::TransactionContext::VerifyInputSignature
          (TransactionContext *this,ByteData *signature,Pubkey *pubkey,OutPoint *outpoint,
          Script *script,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  bool bVar1;
  ByteData sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData256 local_70;
  ByteData local_58;
  SigHashType local_3c;
  
  core::SigHashType::SigHashType(&local_3c,sighash_type);
  (*(this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0x14])
            (&local_58,this,outpoint,script,&local_3c,value,version);
  core::ByteData::GetBytes(&local_88,&local_58);
  core::ByteData256::ByteData256(&local_70,&local_88);
  bVar1 = core::SignatureUtil::VerifyEcSignature(&local_70,pubkey,signature);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool TransactionContext::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const OutPoint& outpoint,
    const Script& script, SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  auto sighash =
      CreateSignatureHash(outpoint, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}